

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON__UINT32 __thiscall
ON_ObjectArray<ON_BrepEdge>::DataCRC(ON_ObjectArray<ON_BrepEdge> *this,ON__UINT32 current_remainder)

{
  ON_BrepEdge *pOVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < (this->super_ON_ClassArray<ON_BrepEdge>).m_count; lVar3 = lVar3 + 1) {
    pOVar1 = (this->super_ON_ClassArray<ON_BrepEdge>).m_a;
    current_remainder =
         (**(code **)(*(long *)((long)&(((ON_CurveProxy *)
                                        (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain + -2))->
                                       super_ON_Curve).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + lVar2) + 0x48))
                   ((long)&(((ON_CurveProxy *)
                            (&(pOVar1->super_ON_CurveProxy).m_real_curve_domain + -2))->
                           super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object + lVar2
                    ,current_remainder);
    lVar2 = lVar2 + 0x88;
  }
  return current_remainder;
}

Assistant:

ON__UINT32 ON_ObjectArray<T>::DataCRC(ON__UINT32 current_remainder) const
{
  // The "this->" in this->m_count and this->m_a 
  // are needed for gcc 4 to compile.
  int i;
  for ( i = 0; i < this->m_count; i++ )
  {
    current_remainder = this->m_a[i].DataCRC(current_remainder);
  }
  return current_remainder;
}